

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clnt.h
# Opt level: O2

void clnt_destroy_it(CLIENT *clnt,char *tag,int line)

{
  uint16_t *puVar1;
  int32_t *piVar2;
  ushort uVar3;
  int iVar4;
  ushort uVar5;
  bool bVar6;
  
  puVar1 = &clnt->cl_flags;
  uVar5 = clnt->cl_flags;
  do {
    LOCK();
    uVar3 = *puVar1;
    bVar6 = uVar5 == uVar3;
    if (bVar6) {
      *puVar1 = uVar5 | 0x20;
      uVar3 = uVar5;
    }
    uVar5 = uVar3;
    UNLOCK();
  } while (!bVar6);
  if (((byte)__ntirpc_pkg_params.debug_flags & 0x10) != 0) {
    (*__ntirpc_pkg_params.warnx_)
              ("%s: %p %d @%s:%d","clnt_destroy_it",clnt,(ulong)(uint)clnt->cl_refcnt,tag,
               (ulong)(uint)line);
  }
  if ((uVar5 & 0x20) == 0) {
    LOCK();
    piVar2 = &clnt->cl_refcnt;
    iVar4 = *piVar2;
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (((byte)__ntirpc_pkg_params.debug_flags & 0x10) != 0) {
      (*__ntirpc_pkg_params.warnx_)
                ("%s: %p %d @%s:%d","clnt_release_it",clnt,(ulong)(iVar4 - 1U),tag,(ulong)(uint)line
                );
    }
    if ((int)(iVar4 - 1U) < 1) {
      LOCK();
      uVar5 = *puVar1;
      *puVar1 = *puVar1 | 0x40;
      UNLOCK();
      if ((uVar5 >> 6 & 1) == 0) {
        (*clnt->cl_ops->cl_destroy)(clnt);
        return;
      }
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)
                  ("%s: %p WARNING! already destroying! @%s:%d","clnt_release_it",clnt,tag,
                   (ulong)(uint)line,__ntirpc_pkg_params.warnx_);
        return;
      }
    }
  }
  return;
}

Assistant:

static inline void clnt_destroy_it(CLIENT *clnt,
				   const char *tag, const int line)
{
	uint16_t flags = atomic_postset_uint16_t_bits(&clnt->cl_flags,
						      CLNT_FLAG_DESTROYING);

	__warnx(TIRPC_DEBUG_FLAG_REFCNT, "%s: %p %" PRId32 " @%s:%d",
		__func__, clnt, clnt->cl_refcnt, tag, line);

	if (flags & CLNT_FLAG_DESTROYING) {
		/* previously set, do nothing */
		return;
	}

	clnt_release_it(clnt, CLNT_RELEASE_FLAG_NONE, tag, line);
}